

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void interface_exec(_func_void_void_ptr *idle_proc,void *idle_data)

{
  double dVar1;
  double dVar2;
  FILE *pFVar3;
  undefined8 uVar4;
  uint channel;
  long lVar5;
  char *__format;
  int iVar6;
  bool bVar7;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  double local_48 [3];
  
  if (arg_simple_interface) {
    while (pFVar3 = _stderr, interrupted_by_signal == '\0') {
      if (idle_proc != (_func_void_void_ptr *)0x0) {
        (*idle_proc)(idle_data);
      }
      fwrite("\x1b[2K",4,1,_stderr);
      local_48[0] = lvcurrent[0];
      local_48[1] = lvcurrent[1];
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        dVar1 = local_48[lVar5];
        fprintf(_stderr," %c ",
                (ulong)(uint)(int)*(char *)((long)&DAT_001962d8 + (long)(int)(&DAT_001962d8)[lVar5])
               );
        pFVar3 = _stderr;
        fputc(0x5b,_stderr);
        dVar2 = 0.0;
        iVar6 = 0x1e;
        while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
          fputc((uint)(dVar1 <= dVar2 / 30.0) * 3 + 0x2a,pFVar3);
          dVar2 = dVar2 + 1.0;
        }
        fputc(0x5d,pFVar3);
        __format = "     ";
        if (1.0 < dVar1) {
          __format = " \x1b[7mCLIP\x1b[0m";
        }
        fprintf(_stderr,__format);
      }
      fputc(0xd,_stderr);
      fflush(_stderr);
      local_50.__r = 0x32;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_50);
    }
    uVar4 = gettext("Interrupted.");
    fprintf(pFVar3,"%s\n",uVar4);
    return;
  }
  curses_interface_exec(idle_proc,idle_data);
  return;
}

Assistant:

void interface_exec(void(*idle_proc)(void *), void *idle_data)
{
#if defined(ADLJACK_USE_CURSES)
    if (arg_simple_interface)
        simple_interface_exec(idle_proc, idle_data);
    else
        curses_interface_exec(idle_proc, idle_data);
#else
    simple_interface_exec();
#endif
}